

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

void __thiscall cmCTestHG::StatusParser::DoPath(StatusParser *this,char status,string *path)

{
  ulong uVar1;
  string *path_local;
  char status_local;
  StatusParser *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((((uVar1 & 1) == 0) && (status != ' ')) &&
     ((status == '!' ||
      ((status != '?' &&
       ((status == 'A' ||
        (((status != 'C' && (status != 'I')) && ((status == 'M' || (status == 'R')))))))))))) {
    (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])(this->HG,1,path);
  }
  return;
}

Assistant:

void DoPath(char status, std::string const& path)
  {
    if (path.empty()) {
      return;
    }

    // See "hg help status".  Note that there is no 'conflict' status.
    switch (status) {
      case 'M':
      case 'A':
      case '!':
      case 'R':
        this->HG->DoModification(PathModified, path);
        break;
      case 'I':
      case '?':
      case 'C':
      case ' ':
      default:
        break;
    }
  }